

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mapper.cpp
# Opt level: O0

int __thiscall Mapper::mapImmediate(Mapper *this,string *value,uchar *bytes,uint *length)

{
  char cVar1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  char *pcVar5;
  invalid_argument anon_var_0;
  out_of_range anon_var_0_1;
  size_t diff_1;
  uint64_t value64_1;
  size_t diff;
  int64_t value64;
  uint *length_local;
  uchar *bytes_local;
  string *value_local;
  Mapper *this_local;
  
  uVar3 = std::__cxx11::string::empty();
  if (((uVar3 & 1) != 0) ||
     ((lVar4 = std::__cxx11::string::length(), lVar4 == 1 &&
      (pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)value), *pcVar5 == '-')))) {
    return -1;
  }
  pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)value);
  if (*pcVar5 != '-') {
    uVar3 = std::__cxx11::string::length();
    if ((2 < uVar3) &&
       (pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)value), *pcVar5 == '\'')) {
      std::__cxx11::string::length();
      pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)value);
      if (*pcVar5 == '\'') {
        lVar4 = std::__cxx11::string::length();
        if (lVar4 == 3) {
          pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)value);
          diff_1 = (size_t)*pcVar5;
        }
        else {
          if ((lVar4 != 4) ||
             (pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)value), *pcVar5 != '\\')) {
            return -1;
          }
          pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)value);
          cVar1 = *pcVar5;
          if (cVar1 == 'n') {
            diff_1 = 10;
          }
          else if (cVar1 == 'r') {
            diff_1 = 0xd;
          }
          else {
            if (cVar1 != 't') {
              return -1;
            }
            diff_1 = 0x74;
          }
        }
        goto LAB_0013b4ce;
      }
    }
    diff_1 = std::__cxx11::stoull(value,(size_t *)0x0,0);
LAB_0013b4ce:
    if (diff_1 < 0x100) {
      *bytes = (uchar)diff_1;
      *length = 1;
      return 0;
    }
    if (diff_1 < 0x10000) {
      *(short *)bytes = (short)diff_1;
      *length = 2;
      return 0x20;
    }
    if (diff_1 < 0x100000000) {
      *(int *)bytes = (int)diff_1;
      *length = 4;
      return 0x40;
    }
    *(size_t *)bytes = diff_1;
    *length = 8;
    return 0x60;
  }
  uVar3 = std::__cxx11::string::length();
  if ((3 < uVar3) &&
     (pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)value), *pcVar5 == '\'')) {
    std::__cxx11::string::length();
    pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)value);
    if (*pcVar5 == '\'') {
      lVar4 = std::__cxx11::string::length();
      if (lVar4 == 4) {
        pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)value);
        diff = -(long)*pcVar5;
      }
      else {
        if ((lVar4 != 5) ||
           (pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)value), *pcVar5 != '\\')) {
          return -1;
        }
        pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)value);
        cVar1 = *pcVar5;
        if (cVar1 == 'n') {
          diff = 0xfffffffffffffff6;
        }
        else if (cVar1 == 'r') {
          diff = 0xfffffffffffffff3;
        }
        else {
          if (cVar1 != 't') {
            return -1;
          }
          diff = 0xffffffffffffff8c;
        }
      }
      goto LAB_0013b30d;
    }
  }
  diff = std::__cxx11::stoll(value,(size_t *)0x0,0);
LAB_0013b30d:
  iVar2 = mapInteger(this,diff,bytes,length);
  return iVar2;
}

Assistant:

int Mapper::mapImmediate(std::string value, unsigned char* bytes, unsigned int &length) {
	if (value.empty() || (value.length() == 1 && value[0] == '-'))
		return -1;
	try {
		if (value[0] == '-')
		{
			int64_t value64;
			if (value.length() > 3 && value[1] == '\'' && value[value.length() - 1] == '\'') {
				size_t diff = value.length() - 1 - 2;
				if (diff == 1) {
					value64 = -static_cast<int64_t>(value[2]);
				}
				else if (diff == 2 && value[2] == '\\') {
					switch (value[3]) {
					case 'n':
						value64 = -'\n';
						break;
					case 'r':
						value64 = -'\r';
						break;
					case 't':
						value64 = -'t';
						break;
					default:
						return -1;
					}

				}
				else
					return -1;
			}
			else
				value64 = std::stoll(value, nullptr,0);
			return mapInteger(value64, bytes, length);
		}
		else {
			uint64_t value64;
			if (value.length() > 2 && value[0] == '\'' && value[value.length() - 1] == '\'') {
				size_t diff = value.length() - 2;
				if (diff == 1) {
					value64 = static_cast<uint64_t>(value[1]);
				}
				else if (diff == 2 && value[1] == '\\') {
					switch (value[2]) {
					case 'n':
						value64 = '\n';
						break;
					case 'r':
						value64 = '\r';
						break;
					case 't':
						value64 = 't';
						break;
					default:
						return -1;
					}
				}
				else
					return -1;
			}
			else
				value64 = std::stoull(value, nullptr, 0);
			if (value64 <= UINT8_MAX) {
				*reinterpret_cast<uint8_t*>(bytes) = static_cast<uint8_t>(value64);
				length = sizeof(uint8_t);
				return Byte;
			}
			else if (value64 <= UINT16_MAX) {
				*reinterpret_cast<uint16_t*>(bytes) = static_cast<uint16_t>(value64);
				length = sizeof(uint16_t);
				return Short;
			}
			else if (value64 <= UINT32_MAX) {
				*reinterpret_cast<uint32_t*>(bytes) = static_cast<uint32_t>(value64);
				length = sizeof(uint32_t);
				return Dword;
			}
			else {
				*reinterpret_cast<uint64_t*>(bytes) = static_cast<uint64_t>(value64);
				length = sizeof(uint64_t);
				return Qword;
			}
		}
	}
	catch (std::invalid_argument) {
		return -1;
	}
	catch (std::out_of_range) {
		return -2;
	}
}